

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_diag_mask_zero(ggml_compute_params *params,ggml_tensor *dst)

{
  if (dst->src[0]->type == GGML_TYPE_F32) {
    ggml_compute_forward_diag_mask_f32(params,dst,0.0);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x121a,"fatal error");
}

Assistant:

void ggml_compute_forward_diag_mask_zero(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_diag_mask_f32(params, dst, 0);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}